

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditFrameworkTests.cpp
# Opt level: O3

int __thiscall dit::FrameworkTests::init(FrameworkTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,"common",
             "Tests for the common utility framework");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_0026ffb0;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "case_list_parser","Test case list parser tests");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00270000;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
             "reference_renderer","Reference renderer tests");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_00270a10;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = &createTextureFormatTests((this->super_TestCaseGroup).super_TestNode.m_testCtx)->
            super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = &createAstcTests((this->super_TestCaseGroup).super_TestNode.m_testCtx)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = &createVulkanTests((this->super_TestCaseGroup).super_TestNode.m_testCtx)->super_TestNode;
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void FrameworkTests::init (void)
{
	addChild(new CommonFrameworkTests	(m_testCtx));
	addChild(new CaseListParserTests	(m_testCtx));
	addChild(new ReferenceRendererTests	(m_testCtx));
	addChild(createTextureFormatTests	(m_testCtx));
	addChild(createAstcTests			(m_testCtx));
	addChild(createVulkanTests			(m_testCtx));
}